

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basewindow_x11.cc
# Opt level: O2

void __thiscall bgui::BaseWindow::showBuffer(BaseWindow *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  BaseWindowData *pBVar5;
  XImage *pXVar6;
  GC p_Var7;
  int iVar8;
  Window WVar9;
  Display *pDVar10;
  int iVar11;
  long lVar12;
  size_t i;
  ulong uVar13;
  int iVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->p->mutex);
  pBVar5 = this->p;
  if (pBVar5->running == true) {
    if ((pBVar5->text)._M_string_length == 0) {
      if ((pBVar5->info)._M_string_length == 0) {
        XPutImage(pBVar5->display,pBVar5->window,pBVar5->gc,pBVar5->image,0,0,0,0,pBVar5->w,
                  pBVar5->h);
      }
      else {
        iVar8 = XTextWidth(pBVar5->font,(pBVar5->info)._M_dataplus._M_p);
        pBVar5 = this->p;
        iVar14 = pBVar5->w;
        iVar2 = pBVar5->font->descent + pBVar5->font->ascent;
        if (pBVar5->top == true) {
          iVar3 = iVar14 - iVar8;
          if (iVar3 != 0 && iVar8 <= iVar14) {
            if (pBVar5->left != true) {
              iVar8 = 0;
            }
            XPutImage(pBVar5->display,pBVar5->window,pBVar5->gc,pBVar5->image,iVar8,0,iVar8,0,iVar3,
                      iVar2);
          }
          pBVar5 = this->p;
          pDVar10 = pBVar5->display;
          WVar9 = pBVar5->window;
          p_Var7 = pBVar5->gc;
          pXVar6 = pBVar5->image;
          iVar14 = pBVar5->w;
          iVar8 = pBVar5->h - iVar2;
        }
        else {
          iVar3 = iVar14 - iVar8;
          if (iVar3 != 0 && iVar8 <= iVar14) {
            iVar14 = pBVar5->h - iVar2;
            if (pBVar5->left != true) {
              iVar8 = 0;
            }
            XPutImage(pBVar5->display,pBVar5->window,pBVar5->gc,pBVar5->image,iVar8,iVar14,iVar8,
                      iVar14,iVar3,iVar2);
          }
          pBVar5 = this->p;
          pDVar10 = pBVar5->display;
          WVar9 = pBVar5->window;
          p_Var7 = pBVar5->gc;
          pXVar6 = pBVar5->image;
          iVar14 = pBVar5->w;
          iVar8 = pBVar5->h - iVar2;
          iVar2 = 0;
        }
        XPutImage(pDVar10,WVar9,p_Var7,pXVar6,0,iVar2,0,iVar2,iVar14,iVar8);
        anon_unknown_0::drawInfoText(this->p);
      }
    }
    else {
      list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      iVar14 = 0;
      gutil::split((vector *)&list,(string *)&pBVar5->text,'\n',false);
      lVar12 = 8;
      iVar8 = 0;
      for (uVar13 = 0;
          uVar13 < (ulong)((long)list.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)list.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5);
          uVar13 = uVar13 + 1) {
        pBVar5 = this->p;
        if (*(long *)((long)&((list.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                     lVar12) != 0) {
          iVar2 = XTextWidth(pBVar5->font,
                             *(undefined8 *)
                              ((long)list.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar12 + -8));
          if (iVar14 <= iVar2) {
            iVar14 = iVar2;
          }
          pBVar5 = this->p;
        }
        iVar8 = iVar8 + pBVar5->font->ascent + pBVar5->font->descent;
        lVar12 = lVar12 + 0x20;
      }
      pBVar5 = this->p;
      iVar2 = pBVar5->w;
      iVar11 = 0;
      iVar3 = 0;
      if (iVar2 - iVar14 != 0 && iVar14 <= iVar2) {
        iVar3 = (iVar2 - iVar14) / 2;
      }
      iVar1 = pBVar5->h;
      iVar4 = iVar1 - iVar8;
      if (((iVar4 != 0 && iVar8 <= iVar1) && (iVar11 = iVar4 / 2, 1 < iVar4)) &&
         (iVar4 = iVar11 + iVar8, iVar4 < iVar1)) {
        XPutImage(pBVar5->display,pBVar5->window,pBVar5->gc,pBVar5->image,0,0,0,0,iVar2,iVar11);
        pBVar5 = this->p;
        XPutImage(pBVar5->display,pBVar5->window,pBVar5->gc,pBVar5->image,0,iVar4,0,iVar4,pBVar5->w,
                  pBVar5->h - iVar4);
        pBVar5 = this->p;
      }
      if ((0 < iVar3) && (iVar14 = iVar14 + iVar3, iVar14 < pBVar5->w)) {
        XPutImage(pBVar5->display,pBVar5->window,pBVar5->gc,pBVar5->image,0,iVar11,0,iVar11,iVar3,
                  iVar8);
        pBVar5 = this->p;
        XPutImage(pBVar5->display,pBVar5->window,pBVar5->gc,pBVar5->image,iVar14,iVar11,iVar14,
                  iVar11,pBVar5->w - iVar14,iVar8);
        pBVar5 = this->p;
      }
      anon_unknown_0::drawInfoText(pBVar5);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&list);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->p->mutex);
  return;
}

Assistant:

void BaseWindow::showBuffer()
{
  pthread_mutex_lock(&(p->mutex));

  if (p->running)
  {
    if (p->text.size() > 0)
    {
      // if text is displayed then draw whole image around text

      std::vector<std::string> list;
      gutil::split(list, p->text, '\n', false);

      int x=0, y=0;
      int w=0, h=0;

      for (size_t i=0; i<list.size(); i++)
      {
        if (list[i].size() > 0)
        {
          w=std::max(w, XTextWidth(p->font, list[i].c_str(), list[i].size()));
        }

        h+=p->font->ascent+p->font->descent;
      }

      if (p->w > w)
      {
        x+=(p->w-w)/2;
      }

      if (p->h > h)
      {
        y+=(p->h-h)/2;
      }

      if (y > 0 && p->h > y+h)
      {
        XPutImage(p->display, p->window, p->gc, p->image, 0, 0, 0, 0, p->w, y);
        XPutImage(p->display, p->window, p->gc, p->image, 0, y+h, 0, y+h, p->w, p->h-y-h);
      }

      if (x > 0 && p->w > x+w)
      {
        XPutImage(p->display, p->window, p->gc, p->image, 0, y, 0, y, x, h);
        XPutImage(p->display, p->window, p->gc, p->image, x+w, y, x+w, y, p->w-x-w, h);
      }

      // draw text

      drawInfoText(p);
    }
    else if (p->info.size() > 0)
    {
      // if info line is displayed then draw whole image except line

      int w=XTextWidth(p->font, p->info.c_str(), p->info.size());
      int h=p->font->ascent+p->font->descent;

      if (p->top)
      {
        if (p->w > w)
        {
          if (p->left)
          {
            XPutImage(p->display, p->window, p->gc, p->image, w, 0, w, 0, p->w-w, h);
          }
          else
          {
            XPutImage(p->display, p->window, p->gc, p->image, 0, 0, 0, 0, p->w-w, h);
          }
        }

        XPutImage(p->display, p->window, p->gc, p->image, 0, h, 0, h, p->w, p->h-h);
      }
      else
      {
        if (p->w > w)
        {
          if (p->left)
          {
            XPutImage(p->display, p->window, p->gc, p->image, w, p->h-h, w, p->h-h, p->w-w, h);
          }
          else
          {
            XPutImage(p->display, p->window, p->gc, p->image, 0, p->h-h, 0, p->h-h, p->w-w, h);
          }
        }

        XPutImage(p->display, p->window, p->gc, p->image, 0, 0, 0, 0, p->w, p->h-h);
      }

      // draw info line

      drawInfoText(p);
    }
    else
    {
      // draw whole image

      XPutImage(p->display, p->window, p->gc, p->image, 0, 0, 0, 0, p->w, p->h);
    }
  }

  pthread_mutex_unlock(&(p->mutex));
}